

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O3

void Abc_NtkGetSeqPoSupp(Abc_Ntk_t *pNtk,int iFrame,int iNumPo)

{
  void *pvVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *__ptr;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  Abc_Obj_t *pNodePo;
  Abc_Obj_t *local_30;
  
  pNtk_00 = Abc_NtkFrames(pNtk,iFrame + 1,0,0);
  uVar2 = pNtk->vPos->nSize * iFrame + iNumPo;
  if ((-1 < (int)uVar2) && ((int)uVar2 < pNtk_00->vPos->nSize)) {
    local_30 = (Abc_Obj_t *)pNtk_00->vPos->pArray[uVar2];
    __ptr = Abc_NtkNodeSupport(pNtk_00,&local_30,1);
    pVVar4 = pNtk_00->vCis;
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)pVVar4->pArray[lVar3] + 0x40) = 0;
        lVar3 = lVar3 + 1;
        pVVar4 = pNtk_00->vCis;
      } while (lVar3 < pVVar4->nSize);
    }
    if (0 < __ptr->nSize) {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)__ptr->pArray[lVar3] + 0x40) = 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 < __ptr->nSize);
    }
    pVVar4 = pNtk->vCis;
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)pVVar4->pArray[lVar3] + 0x40) = 0;
        lVar3 = lVar3 + 1;
        pVVar4 = pNtk->vCis;
      } while (lVar3 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vBoxes;
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        if ((*(uint *)((long)pVVar4->pArray[lVar3] + 0x14) & 0xf) == 8) {
          if (pNtk_00->vBoxes->nSize <= lVar3) goto LAB_00320895;
          if (*(long *)((long)pNtk_00->vBoxes->pArray[lVar3] + 0x40) != 0) {
            *(undefined8 *)((long)pVVar4->pArray[lVar3] + 0x40) = 1;
            pVVar4 = pNtk->vBoxes;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vPis;
    if (0 < pVVar4->nSize) {
      lVar3 = 0;
      do {
        if (-1 < iFrame) {
          pvVar1 = pVVar4->pArray[lVar3];
          iVar5 = 0;
          do {
            uVar2 = pNtk->vPis->nSize * iVar5 + (int)lVar3;
            if (((int)uVar2 < 0) || (pNtk_00->vPis->nSize <= (int)uVar2)) goto LAB_00320895;
            if (*(long *)((long)pNtk_00->vPis->pArray[uVar2] + 0x40) != 0) {
              *(undefined8 *)((long)pvVar1 + 0x40) = 1;
            }
            iVar5 = iVar5 + 1;
          } while (iFrame + 1 != iVar5);
          pVVar4 = pNtk->vPis;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < pVVar4->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    Abc_NtkDelete(pNtk_00);
    return;
  }
LAB_00320895:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkGetSeqPoSupp( Abc_Ntk_t * pNtk, int iFrame, int iNumPo )
{
    Abc_Ntk_t * pFrames;
    Abc_Obj_t * pObj, * pNodePo;
    Vec_Ptr_t * vSupp;
    int i, k;
    // get the timeframes of the network
    pFrames = Abc_NtkFrames( pNtk, iFrame + 1, 0, 0 );
//Abc_NtkShowAig( pFrames );

    // get the PO of the timeframes
    pNodePo = Abc_NtkPo( pFrames, iFrame * Abc_NtkPoNum(pNtk) + iNumPo );
    // set the support
    vSupp   = Abc_NtkNodeSupport( pFrames, &pNodePo, 1 );
    // mark the support of the frames
    Abc_NtkForEachCi( pFrames, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)1;
    // mark the support of the network if the support of the timeframes is marked
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_NtkBox(pFrames, i)->pCopy )
            pObj->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        for ( k = 0; k <= iFrame; k++ )
            if ( Abc_NtkPi(pFrames, k*Abc_NtkPiNum(pNtk) + i)->pCopy )
                pObj->pCopy = (Abc_Obj_t *)1;
    // free stuff
    Vec_PtrFree( vSupp );
    Abc_NtkDelete( pFrames );
}